

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t validate_part_type(_internal_exr_context *f,_internal_exr_part *curpart)

{
  exr_result_t eVar1;
  char *in_RSI;
  exr_attr_string_t *in_RDI;
  int rv;
  int32_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((*(long *)(in_RSI + 0x70) != 0) && (*(char *)((long)&in_RDI->length + 3) != '\0')) &&
     (*(int *)(in_RSI + 4) != 1)) {
    in_RSI[4] = '\x01';
    in_RSI[5] = '\0';
    in_RSI[6] = '\0';
    in_RSI[7] = '\0';
    (*(code *)in_RDI[4].str)
              (in_RDI,0xe,
               "attribute \'type\': Mismatch between file flags and type string \'%s\', believing file flags"
               ,*(undefined8 *)(*(long *)(*(long *)(in_RSI + 0x70) + 0x18) + 8));
    if ((char)in_RDI->length == '\x01') {
      return 0xe;
    }
    eVar1 = exr_attr_string_set_with_length
                      ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,in_stack_ffffffffffffffe4);
    if (eVar1 != 0) {
      eVar1 = (*(code *)in_RDI[4].str)
                        (in_RDI,0xe,
                         "attribute \'type\': Mismatch between file flags and type attribute, unable to fix"
                        );
      return eVar1;
    }
  }
  return 0;
}

Assistant:

static exr_result_t
validate_part_type (
    struct _internal_exr_context* f, struct _internal_exr_part* curpart)
{
    // TODO: there are probably more tests to add here...
    if (curpart->type)
    {
        int rv;

        // see if the type overwrote the storage mode
        if (f->is_singlepart_tiled &&
            curpart->storage_mode != EXR_STORAGE_TILED)
        {
            // mismatch between type attr and file flag. c++ believed the
            // flag first and foremost
            curpart->storage_mode = EXR_STORAGE_TILED;

            // TODO: define how strict we should be
            //exr_attr_list_remove( f, &(curpart->attributes), curpart->type );
            //curpart->type = NULL;
            f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "attribute 'type': Mismatch between file flags and type string '%s', believing file flags",
                curpart->type->string->str);

            if (f->mode == EXR_CONTEXT_WRITE) return EXR_ERR_INVALID_ATTR;

            rv = exr_attr_string_set_with_length (
                (exr_context_t) f, curpart->type->string, "tiledimage", 10);
            if (rv != EXR_ERR_SUCCESS)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "attribute 'type': Mismatch between file flags and type attribute, unable to fix");
        }
    }

    return EXR_ERR_SUCCESS;
}